

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KuhnAlgorithm.cpp
# Opt level: O2

void __thiscall
BoxNesting::KuhnAlgorithm::KuhnAlgorithm
          (KuhnAlgorithm *this,vector<BoxNesting::Box,_std::allocator<BoxNesting::Box>_> *boxes)

{
  pointer pBVar1;
  bool bVar2;
  short sVar3;
  int16_t i;
  long lVar4;
  allocator_type local_6b;
  ushort local_6a;
  vector<short,_std::allocator<short>_> *local_68;
  vector<bool,_std::allocator<bool>_> *local_60;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->graph).
  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pairsRight).super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar3 = (short)(((long)(boxes->
                         super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(boxes->
                        super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0x18);
  this->leftVerticesCount = sVar3;
  this->rightVerticesCount = sVar3;
  local_6a = 0xffff;
  local_68 = &this->pairsLeft;
  local_60 = &this->used;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_58,(long)sVar3,
             (value_type_conflict4 *)&local_6a,&local_6b);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->pairsLeft,&local_58);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            ((_Vector_base<short,_std::allocator<short>_> *)&local_58);
  local_6a = 0xffff;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_58,(long)this->rightVerticesCount,
             (value_type_conflict4 *)&local_6a,&local_6b);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->pairsRight,&local_58);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            ((_Vector_base<short,_std::allocator<short>_> *)&local_58);
  local_6a = local_6a & 0xff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,(long)this->leftVerticesCount,
             (bool *)&local_6a,(allocator_type *)&local_6b);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (&this->used,(vector<bool,_std::allocator<bool>_> *)&local_58);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  std::
  vector<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
  ::resize(&this->graph,(long)this->leftVerticesCount);
  for (lVar4 = 0; lVar4 < this->leftVerticesCount; lVar4 = lVar4 + 1) {
    std::vector<short,_std::allocator<short>_>::reserve
              ((this->graph).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar4,(long)this->rightVerticesCount);
    for (local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_2_ = 0;
        (short)local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p <
        this->rightVerticesCount;
        local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_2_ =
             (short)local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
             + 1) {
      pBVar1 = (boxes->super__Vector_base<BoxNesting::Box,_std::allocator<BoxNesting::Box>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar2 = Box::operator<(pBVar1 + lVar4,
                             pBVar1 + (short)local_58._M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p);
      if (bVar2) {
        std::vector<short,std::allocator<short>>::emplace_back<short&>
                  ((vector<short,std::allocator<short>> *)
                   ((this->graph).
                    super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar4),(short *)&local_58);
      }
    }
    std::vector<short,_std::allocator<short>_>::_M_shrink_to_fit
              ((this->graph).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar4);
  }
  return;
}

Assistant:

KuhnAlgorithm::KuhnAlgorithm(const std::vector<Box>& boxes)
{
	// In the boxes case left and right vertices are the same amount since
	// they are the amount of boxes
	this->leftVerticesCount = static_cast<int16_t>(boxes.size());
	this->rightVerticesCount = this->leftVerticesCount;

	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount, -1);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount, -1);
	this->used = std::vector<bool>(this->leftVerticesCount, false);

	this->graph.resize(this->leftVerticesCount);
	for (int16_t i = 0; i < this->leftVerticesCount; ++i) {
		this->graph[i].reserve(this->rightVerticesCount);
		for (int16_t j = 0; j < this->rightVerticesCount; ++j) {
			if (boxes[i] < boxes[j]) {
				this->graph[i].emplace_back(j);
			}
		}
		this->graph[i].shrink_to_fit();
	}
}